

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_statics.cpp
# Opt level: O0

ON_DimStyle * Internal_DimStyleMillimeterSmall(void)

{
  ON_UUID id_00;
  ON_DimStyle *in_RDI;
  ON_UUID id;
  ON_DimStyle *dimstyle;
  
  ON_DimStyle::ON_DimStyle(in_RDI);
  id_00.Data4[0] = 0x89;
  id_00.Data4[1] = 'G';
  id_00.Data4[2] = '\x03';
  id_00.Data4[3] = 0xa0;
  id_00.Data4[4] = 'H';
  id_00.Data4[5] = 0xed;
  id_00.Data4[6] = 0xde;
  id_00.Data4[7] = 'V';
  id_00.Data1 = 0xdbe22573;
  id_00.Data2 = 0x8cad;
  id_00.Data3 = 0x4ced;
  Internal_DimStyleInit(L"Millimeter Small",-5,id_00,in_RDI);
  Internal_DimStyleMillimeterSmallInit(in_RDI);
  Internal_SystemDimStyleFinalize(in_RDI);
  return in_RDI;
}

Assistant:

static ON_DimStyle Internal_DimStyleMillimeterSmall()
{
  const ON_UUID id =
  { 0xdbe22573, 0x8cad, 0x4ced,{ 0x89, 0x47, 0x3, 0xa0, 0x48, 0xed, 0xde, 0x56 } };

  ON_DimStyle dimstyle;
  Internal_DimStyleInit(L"Millimeter Small", -5, id, dimstyle);
  Internal_DimStyleMillimeterSmallInit(dimstyle);
  Internal_SystemDimStyleFinalize(dimstyle);
  return dimstyle;
}